

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

float64 cluster(int32 ts,uint32 n_stream,uint32 n_in_frame,uint32 *veclen,uint32 blksize,
               vector_t **mean,uint32 n_density,codew_t **out_label)

{
  int *piVar1;
  vector_t pfVar2;
  vector_t pfVar3;
  vector_t pfVar4;
  vector_t pfVar5;
  float32 *pfVar6;
  uint32 n_obs;
  int iVar7;
  uint uVar8;
  cmd_ln_t *pcVar9;
  char *__s1;
  long lVar10;
  vector_t *mean_00;
  void *__s;
  void *pvVar11;
  void *pvVar12;
  uint uVar13;
  codew_t *pcVar14;
  ulong uVar15;
  ulong d1;
  double dVar16;
  ulong uVar17;
  ulong uVar18;
  uint32 veclen_00;
  double dVar19;
  float fVar20;
  double dVar21;
  float64 fVar22;
  codew_t *local_c0;
  double local_b8;
  double local_b0;
  ulong local_a8;
  codew_t *local_a0;
  vector_t *local_98;
  codew_t *local_90;
  uint32 local_84;
  vector_t *local_80;
  long local_78;
  ulong local_70;
  uint32 local_64;
  uint32 local_60;
  uint32 local_5c;
  uint32 *local_58;
  vector_t **local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  *out_label = (codew_t *)0x0;
  local_64 = ts;
  local_60 = n_in_frame;
  local_5c = blksize;
  local_50 = mean;
  k_means_set_get_obs(get_obs);
  if (n_stream == 0) {
    local_40 = 0.0;
  }
  else {
    d1 = (ulong)n_density;
    local_38 = 9.88131291682493e-324;
    if (2 < n_density) {
      local_38 = (double)(ulong)n_density;
    }
    local_48 = (ulong)n_stream;
    local_40 = 0.0;
    fVar22 = 0.0;
    uVar18 = 0;
    local_84 = n_stream;
    local_58 = veclen;
    do {
      pcVar9 = cmd_ln_get();
      __s1 = cmd_ln_str_r(pcVar9,"-method");
      n_obs = setup_obs(local_64,(uint32)uVar18,local_60,n_stream,veclen,local_5c);
      iVar7 = strcmp(__s1,"rkm");
      if (iVar7 == 0) {
        pcVar9 = cmd_ln_get();
        lVar10 = cmd_ln_int_r(pcVar9,"-ntrial");
        uVar13 = veclen[uVar18];
        uVar17 = (ulong)uVar13;
        local_80 = local_50[uVar18];
        local_70 = uVar18;
        pcVar9 = cmd_ln_get();
        dVar21 = cmd_ln_float_r(pcVar9,"-minratio");
        pcVar9 = cmd_ln_get();
        local_90 = (codew_t *)cmd_ln_int_r(pcVar9,"-maxiter");
        local_c0 = (codew_t *)0x0;
        mean_00 = (vector_t *)
                  __ckd_calloc_2d__(d1,uVar17,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                    ,0x23f);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x241,"Initializing means using random k-means\n");
        local_78 = lVar10;
        if ((int)lVar10 == 0) {
          pcVar14 = (codew_t *)0x0;
          fVar20 = INFINITY;
        }
        else {
          local_98 = (vector_t *)CONCAT44(local_98._4_4_,(float)dVar21);
          uVar18 = 0;
          local_b0 = 1.8e+307;
          local_a0 = (codew_t *)0x0;
          do {
            local_a8 = uVar18;
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                    ,0x244,"Trial %u: %u means\n",uVar18,(ulong)n_density);
            iVar7 = 100;
            do {
              if (n_density != 0) {
                uVar18 = 0;
                do {
                  dVar21 = drand48();
                  pfVar6 = obuf;
                  uVar8 = (uint)(long)((float)dVar21 * (float)n_obs);
                  if (n_obs <= uVar8) {
                    __assert_fail("(cc >= 0) && (cc < n_obs)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                  ,0x24c,
                                  "float32 random_kmeans(uint32, uint32, uint32, vector_t *, uint32, float32, uint32, codew_t **)"
                                 );
                  }
                  if (uVar17 != 0) {
                    uVar8 = uVar8 * vlen;
                    pfVar2 = mean_00[uVar18];
                    uVar15 = 0;
                    do {
                      pfVar2[uVar15] = (float)pfVar6[uVar8 + uVar15];
                      uVar15 = uVar15 + 1;
                    } while (uVar17 != uVar15);
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != d1);
              }
              if (n_density < 2) {
                dVar21 = (double)k_means(mean_00,n_density,n_obs,uVar13,local_98._0_4_,
                                         (uint32)local_90,&local_c0);
              }
              else {
                dVar21 = (double)k_means_trineq(mean_00,n_density,n_obs,uVar13,local_98._0_4_,
                                                (uint32)local_90,&local_c0);
              }
              if (dVar21 < 0.0) {
                local_b8 = dVar21;
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                        ,0x265,"\t-> Aborting k-means, bad initialization\n");
                iVar7 = iVar7 + -1;
                dVar21 = local_b8;
              }
            } while ((dVar21 < 0.0) && (iVar7 != 0));
            if (local_b0 <= dVar21) {
              if (local_c0 != (codew_t *)0x0) {
                ckd_free(local_c0);
                local_c0 = (codew_t *)0x0;
              }
LAB_001050d4:
              iVar7 = (int)local_a8;
            }
            else {
              local_b8 = dVar21;
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                      ,0x26e,"\tbest-so-far sqerr = %e\n",dVar21);
              if (local_a0 != (codew_t *)0x0) {
                ckd_free(local_a0);
              }
              local_a0 = local_c0;
              if (n_density == 0) {
                local_b0 = local_b8;
                goto LAB_001050d4;
              }
              uVar18 = 0;
              iVar7 = (int)local_a8;
              do {
                if (uVar17 != 0) {
                  pfVar2 = mean_00[uVar18];
                  pfVar3 = local_80[uVar18];
                  uVar15 = 0;
                  do {
                    pfVar3[uVar15] = pfVar2[uVar15];
                    uVar15 = uVar15 + 1;
                  } while (uVar17 != uVar15);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 != d1);
              local_b0 = local_b8;
            }
            uVar18 = (ulong)(iVar7 + 1U);
          } while (iVar7 + 1U != (uint)local_78);
          fVar20 = (float)local_b0;
          pcVar14 = local_a0;
        }
        *out_label = pcVar14;
        ckd_free_2d(mean_00);
        if (fVar20 < 0.0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                  ,0x349,"Too few observations for kmeans\n");
          return -1.0;
        }
        fVar22 = (float64)(double)fVar20;
        uVar18 = local_70;
        veclen = local_58;
        n_stream = local_84;
      }
      else {
        iVar7 = strcmp(__s1,"fnkm");
        if (iVar7 == 0) {
          uVar13 = veclen[uVar18];
          local_80 = local_50[uVar18];
          local_70 = uVar18;
          pcVar9 = cmd_ln_get();
          dVar21 = cmd_ln_float_r(pcVar9,"-minratio");
          local_a0 = (codew_t *)CONCAT44(local_a0._4_4_,(float)dVar21);
          pcVar9 = cmd_ln_get();
          local_78 = cmd_ln_int_r(pcVar9,"-maxiter");
          local_a8 = (ulong)n_obs;
          local_c0 = (codew_t *)
                     __ckd_calloc__(local_a8,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                    ,0x2f1);
          __s = __ckd_calloc__(d1,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                               ,0x2f2);
          local_b0 = (double)(ulong)uVar13;
          local_98 = (vector_t *)
                     __ckd_calloc_2d__(2,(ulong)uVar13,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                       ,0x2f5);
          uVar17 = 0;
          dVar21 = 4.94065645841247e-324;
          do {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                    ,0x2f8,"n_mean == %u\n",(ulong)dVar21 & 0xffffffff);
            local_90 = local_c0;
            pvVar11 = __ckd_calloc__((size_t)dVar21,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                     ,0x2c2);
            local_b8 = dVar21;
            memset(__s,0,(long)dVar21 * 4);
            dVar21 = local_b8;
            if (n_obs != 0) {
              uVar18 = 0;
              do {
                piVar1 = (int *)((long)__s + (ulong)local_90[uVar18] * 4);
                *piVar1 = *piVar1 + 1;
                uVar18 = uVar18 + 1;
              } while (local_a8 != uVar18);
            }
            dVar19 = 0.0;
            do {
              pvVar12 = __ckd_calloc__((ulong)*(uint *)((long)__s + (long)dVar19 * 4),4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                       ,0x2cc);
              *(void **)((long)pvVar11 + (long)dVar19 * 8) = pvVar12;
              dVar19 = (double)((long)dVar19 + 1);
            } while (dVar21 != dVar19);
            pvVar12 = __ckd_calloc__((size_t)dVar21,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                     ,0x2cf);
            dVar21 = local_b8;
            if (n_obs != 0) {
              uVar18 = 0;
              do {
                uVar15 = (ulong)local_90[uVar18];
                lVar10 = *(long *)((long)pvVar11 + uVar15 * 8);
                uVar13 = *(uint *)((long)pvVar12 + uVar15 * 4);
                *(uint *)((long)pvVar12 + uVar15 * 4) = uVar13 + 1;
                *(int *)(lVar10 + (ulong)uVar13 * 4) = (int)uVar18;
                uVar18 = uVar18 + 1;
              } while (local_a8 != uVar18);
            }
            dVar19 = 0.0;
            do {
              if (*(int *)((long)pvVar12 + (long)dVar19 * 4) !=
                  *(int *)((long)__s + (long)dVar19 * 4)) {
                __assert_fail("free[k] == occ_cnt[k]",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                              ,0x2d8,"uint32 **cw_obs(codew_t *, uint32, uint32, uint32 *)");
              }
              dVar19 = (double)((long)dVar19 + 1);
            } while (local_b8 != dVar19);
            ckd_free(pvVar12);
            dVar19 = 0.0;
            uVar13 = 0;
            do {
              uVar8 = *(uint *)((long)__s + (long)dVar19 * 4);
              if (uVar13 < uVar8) {
                uVar17 = (ulong)dVar19 & 0xffffffff;
                uVar13 = uVar8;
              }
              dVar19 = (double)((long)dVar19 + 1);
            } while (dVar21 != dVar19);
            find_farthest_neigh(*(uint32 **)((long)pvVar11 + uVar17 * 8),
                                *(uint32 *)((long)__s + uVar17 * 4),SUB84(local_b0,0),*local_98,
                                local_98[1]);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                    ,0x309,"d_max == %e\n");
            dVar19 = local_b0;
            dVar21 = local_b8;
            veclen_00 = SUB84(local_b0,0);
            k_means_subset(local_98,2,*(uint32 **)((long)pvVar11 + uVar17 * 8),
                           *(uint32 *)((long)__s + uVar17 * 4),veclen_00,local_a0._0_4_,
                           (uint32)local_78,(codew_t **)0x0);
            if (dVar19 != 0.0) {
              pfVar2 = *local_98;
              pfVar3 = local_98[1];
              pfVar4 = local_80[uVar17];
              pfVar5 = local_80[(long)dVar21];
              dVar16 = 0.0;
              do {
                pfVar4[(long)dVar16] = pfVar2[(long)dVar16];
                pfVar5[(long)dVar16] = pfVar3[(long)dVar16];
                dVar16 = (double)((long)dVar16 + 1);
              } while (dVar19 != dVar16);
            }
            dVar21 = (double)((long)dVar21 + 1);
            ckd_free(local_c0);
            fVar22 = k_means(local_80,SUB84(dVar21,0),n_obs,veclen_00,local_a0._0_4_,
                             (uint32)local_78,&local_c0);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                    ,0x322,"\tsquerr == %e\n");
            uVar18 = local_70;
            veclen = local_58;
            n_stream = local_84;
          } while (dVar21 != local_38);
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                  ,0x357,"I don\'t know how to do method \'%s\'.  Sorry.\n",__s1);
        }
      }
      uVar18 = uVar18 + 1;
      local_40 = local_40 + (double)fVar22;
    } while (uVar18 != local_48);
  }
  return (float64)local_40;
}

Assistant:

float64
cluster(int32 ts,
	uint32 n_stream,
	uint32 n_in_frame,
	uint32 *veclen,
	uint32 blksize,
	vector_t **mean,
	uint32 n_density,
	codew_t **out_label)
{
    float64 sum_sqerr, sqerr=0;
    uint32 s, n_frame;
    const char *meth;
    
    *out_label = NULL;

    k_means_set_get_obs(&get_obs);

    for (s = 0, sum_sqerr = 0; s < n_stream; s++, sum_sqerr += sqerr) {
	meth = cmd_ln_str("-method");

	n_frame = setup_obs(ts, s, n_in_frame, n_stream, veclen, blksize);

	if (strcmp(meth, "rkm") == 0) {
	    sqerr = random_kmeans(cmd_ln_int32("-ntrial"),
				  n_frame,
				  veclen[s],
				  mean[s],
				  n_density,
				  cmd_ln_float32("-minratio"),
				  cmd_ln_int32("-maxiter"),
				  out_label);
	    if (sqerr < 0) {
		E_ERROR("Too few observations for kmeans\n");
		
		return -1.0;
	    }
	}
	else if (strcmp(meth, "fnkm") == 0) {
	    sqerr = furthest_neighbor_kmeans(n_frame,
					     veclen[s],
					     mean[s],
					     n_density,
					     cmd_ln_float32("-minratio"),
					     cmd_ln_int32("-maxiter"));
	}
	else {
	    E_ERROR("I don't know how to do method '%s'.  Sorry.\n", meth);
	}
    }

    return sum_sqerr;
}